

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O3

CheckedError __thiscall
flatbuffers::Parser::StartParseFile(Parser *this,char *source,char *source_filename)

{
  char *pcVar1;
  char *in_RCX;
  CheckedError *ce;
  long *local_50 [2];
  long local_40 [2];
  
  if (in_RCX == (char *)0x0) {
    in_RCX = "";
  }
  pcVar1 = *(char **)(source + 0x710);
  strlen(in_RCX);
  std::__cxx11::string::_M_replace((ulong)(source + 0x708),0,pcVar1,(ulong)in_RCX);
  *(char **)(source + 0x728) = source_filename;
  *(char **)source = source_filename;
  *(char **)(source + 8) = source_filename;
  *(char **)(source + 0x10) = source_filename;
  source[0x18] = '\x01';
  source[0x19] = '\0';
  source[0x1a] = '\0';
  source[0x1b] = '\0';
  source[0x1b0] = '\0';
  source[0x1b1] = '\0';
  source[0x1b2] = '\0';
  source[0x1b3] = '\0';
  source[0x1b4] = '\0';
  source[0x1b5] = '\0';
  source[0x1b6] = '\0';
  source[0x1b7] = '\0';
  **(undefined1 **)(source + 0x1a8) = 0;
  SkipByteOrderMark(this);
  *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
  if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
    Next(this);
    *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
    if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
      if (*(int *)(source + 0x1c) == 0x100) {
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"input file is empty","")
        ;
        Error(this,(string *)source);
        if (local_50[0] != local_40) {
          operator_delete(local_50[0],local_40[0] + 1);
        }
      }
      else {
        *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0;
      }
    }
  }
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::StartParseFile(const char *source,
                                    const char *source_filename) {
  file_being_parsed_ = source_filename ? source_filename : "";
  source_ = source;
  ResetState(source_);
  error_.clear();
  ECHECK(SkipByteOrderMark());
  NEXT();
  if (Is(kTokenEof)) return Error("input file is empty");
  return NoError();
}